

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

void ot::commissioner::HandleMbedtlsDebug(void *param_1,int level,char *file,int line,char *str)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar1;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  anon_class_1_0_00000001 local_53a;
  v10 local_539;
  v10 *local_538;
  char *local_530;
  string local_528;
  allocator local_501;
  string local_500;
  anon_class_1_0_00000001 local_4da;
  v10 local_4d9;
  v10 *local_4d8;
  char *local_4d0;
  string local_4c8;
  allocator local_4a1;
  string local_4a0;
  anon_class_1_0_00000001 local_47a;
  v10 local_479;
  v10 *local_478;
  char *local_470;
  string local_468;
  allocator local_441;
  string local_440;
  anon_class_1_0_00000001 local_41a;
  v10 local_419;
  v10 *local_418;
  char *local_410;
  string local_408;
  allocator local_3d1;
  string local_3d0;
  char *local_3b0;
  char *str_local;
  char *pcStack_3a0;
  int line_local;
  char *file_local;
  void *pvStack_390;
  int level_local;
  void *param_0_local;
  undefined1 local_358 [16];
  v10 *local_348;
  char *local_340;
  char **local_338;
  char **local_330;
  v10 *local_328;
  v10 *local_320;
  char *pcStack_318;
  string *local_310;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  local_308;
  undefined1 local_2d8 [16];
  v10 *local_2c8;
  char *local_2c0;
  char **local_2b8;
  char **local_2b0;
  v10 *local_2a8;
  v10 *local_2a0;
  char *pcStack_298;
  string *local_290;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  local_288;
  undefined1 local_258 [16];
  v10 *local_248;
  char *local_240;
  char **local_238;
  char **local_230;
  v10 *local_228;
  v10 *local_220;
  char *pcStack_218;
  string *local_210;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  local_208;
  undefined1 local_1d0 [16];
  v10 *local_1c0;
  char *local_1b8;
  char **local_1b0;
  char **local_1a8;
  v10 *local_1a0;
  v10 *local_198;
  char *pcStack_190;
  string *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  v10 **local_168;
  v10 *local_160;
  v10 **local_158;
  v10 *local_150;
  v10 **local_148;
  v10 **local_140;
  v10 *local_138;
  char *pcStack_130;
  v10 **local_120;
  v10 *local_118;
  char *pcStack_110;
  v10 **local_100;
  v10 *local_f8;
  char *pcStack_f0;
  v10 **local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  *local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  *local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  *local_a8;
  undefined1 *local_a0;
  void **local_98;
  undefined1 *local_90;
  void **local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  *local_70;
  void **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  *local_50;
  undefined8 local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  *local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
  *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_3b0 = str;
  str_local._4_4_ = line;
  pcStack_3a0 = file;
  file_local._4_4_ = level;
  pvStack_390 = param_1;
  switch(level) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d0,"mbedtls",&local_3d1);
    HandleMbedtlsDebug::anon_class_1_0_00000001::operator()(&local_41a);
    local_178 = &local_418;
    local_180 = &local_419;
    bVar1 = ::fmt::v10::operator()(local_180);
    local_410 = (char *)bVar1.size_;
    local_418 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::
    check_format_string<const_char_*&,_int_&,_const_char_*&,_FMT_COMPILE_STRING,_0>();
    local_188 = &local_408;
    local_198 = local_418;
    pcStack_190 = local_410;
    local_1a0 = (v10 *)&stack0xfffffffffffffc60;
    local_1a8 = (char **)((long)&str_local + 4);
    local_1b0 = &local_3b0;
    local_140 = &local_198;
    local_1c0 = local_418;
    local_1b8 = local_410;
    local_138 = local_1c0;
    pcStack_130 = local_1b8;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*,int,char_const*>
              (&local_208,local_1a0,local_1a8,(int *)local_1b0,(char **)str);
    local_c0 = local_1d0;
    local_c8 = &local_208;
    local_18 = 0xc1c;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_c8;
    fmt.size_ = 0xc1c;
    fmt.data_ = local_1b8;
    local_70 = local_c8;
    local_20 = local_c8;
    local_10 = local_c0;
    ::fmt::v10::vformat_abi_cxx11_(&local_408,local_1c0,fmt,args);
    Log(kCritical,&local_3d0,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_440,"mbedtls",&local_441);
    HandleMbedtlsDebug::anon_class_1_0_00000001::operator()(&local_47a);
    local_168 = &local_478;
    local_170 = &local_479;
    bVar1 = ::fmt::v10::operator()(local_170);
    local_470 = (char *)bVar1.size_;
    local_478 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::
    check_format_string<const_char_*&,_int_&,_const_char_*&,_FMT_COMPILE_STRING,_0>();
    local_210 = &local_468;
    local_220 = local_478;
    pcStack_218 = local_470;
    local_228 = (v10 *)&stack0xfffffffffffffc60;
    local_230 = (char **)((long)&str_local + 4);
    local_238 = &local_3b0;
    local_120 = &local_220;
    local_248 = local_478;
    local_240 = local_470;
    local_118 = local_248;
    pcStack_110 = local_240;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*,int,char_const*>
              (&local_288,local_228,local_230,(int *)local_238,(char **)str);
    local_b0 = local_258;
    local_b8 = &local_288;
    local_30 = 0xc1c;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_b8;
    fmt_00.size_ = 0xc1c;
    fmt_00.data_ = local_240;
    local_78 = local_b8;
    local_38 = local_b8;
    local_28 = local_b0;
    ::fmt::v10::vformat_abi_cxx11_(&local_468,local_248,fmt_00,args_00);
    Log(kWarn,&local_440,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator((allocator<char> *)&local_441);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a0,"mbedtls",&local_4a1);
    HandleMbedtlsDebug::anon_class_1_0_00000001::operator()(&local_4da);
    local_158 = &local_4d8;
    local_160 = &local_4d9;
    bVar1 = ::fmt::v10::operator()(local_160);
    local_4d0 = (char *)bVar1.size_;
    local_4d8 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::
    check_format_string<const_char_*&,_int_&,_const_char_*&,_FMT_COMPILE_STRING,_0>();
    local_290 = &local_4c8;
    local_2a0 = local_4d8;
    pcStack_298 = local_4d0;
    local_2a8 = (v10 *)&stack0xfffffffffffffc60;
    local_2b0 = (char **)((long)&str_local + 4);
    local_2b8 = &local_3b0;
    local_100 = &local_2a0;
    local_2c8 = local_4d8;
    local_2c0 = local_4d0;
    local_f8 = local_2c8;
    pcStack_f0 = local_2c0;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*,int,char_const*>
              (&local_308,local_2a8,local_2b0,(int *)local_2b8,(char **)str);
    local_a0 = local_2d8;
    local_a8 = &local_308;
    local_48 = 0xc1c;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)local_a8;
    fmt_01.size_ = 0xc1c;
    fmt_01.data_ = local_2c0;
    local_80 = local_a8;
    local_50 = local_a8;
    local_40 = local_a0;
    ::fmt::v10::vformat_abi_cxx11_(&local_4c8,local_2c8,fmt_01,args_01);
    Log(kInfo,&local_4a0,&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    break;
  case 4:
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_500,"mbedtls",&local_501);
    HandleMbedtlsDebug::anon_class_1_0_00000001::operator()(&local_53a);
    local_148 = &local_538;
    local_150 = &local_539;
    bVar1 = ::fmt::v10::operator()(local_150);
    local_530 = (char *)bVar1.size_;
    local_538 = (v10 *)bVar1.data_;
    ::fmt::v10::detail::
    check_format_string<const_char_*&,_int_&,_const_char_*&,_FMT_COMPILE_STRING,_0>();
    local_310 = &local_528;
    local_320 = local_538;
    pcStack_318 = local_530;
    local_328 = (v10 *)&stack0xfffffffffffffc60;
    local_330 = (char **)((long)&str_local + 4);
    local_338 = &local_3b0;
    local_e0 = &local_320;
    local_348 = local_538;
    local_340 = local_530;
    local_d8 = local_348;
    pcStack_d0 = local_340;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*,int,char_const*>
              ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_int,_const_char_*>
                *)&param_0_local,local_328,local_330,(int *)local_338,(char **)str);
    local_90 = local_358;
    local_98 = &param_0_local;
    local_60 = 0xc1c;
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)local_98;
    fmt_02.size_ = 0xc1c;
    fmt_02.data_ = local_340;
    local_88 = local_98;
    local_68 = local_98;
    local_58 = local_90;
    ::fmt::v10::vformat_abi_cxx11_(&local_528,local_348,fmt_02,args_02);
    Log(kDebug,&local_500,&local_528);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator((allocator<char> *)&local_501);
  }
  return;
}

Assistant:

static void HandleMbedtlsDebug(void *, int level, const char *file, int line, const char *str)
{
    switch (level)
    {
    case 1:
        LOG_CRIT(LOG_REGION_MBEDTLS, "{}, {}: {}", file, line, str);
        break;

    case 2:
        LOG_WARN(LOG_REGION_MBEDTLS, "{}, {}: {}", file, line, str);
        break;

    case 3:
        LOG_INFO(LOG_REGION_MBEDTLS, "{}, {}: {}", file, line, str);
        break;

    case 4:
    default:
        LOG_DEBUG(LOG_REGION_MBEDTLS, "{}, {}: {}", file, line, str);
        break;
    }
}